

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void us_internal_loop_post(us_loop_t *loop)

{
  us_socket_t *puVar1;
  us_socket_t *p;
  
  p = (loop->data).closed_head;
  if (p != (us_socket_t *)0x0) {
    do {
      puVar1 = p->next;
      us_poll_free(&p->p,loop);
      p = puVar1;
    } while (puVar1 != (us_socket_t *)0x0);
    (loop->data).closed_head = (us_socket_t *)0x0;
  }
  (*(loop->data).post_cb)(loop);
  return;
}

Assistant:

void us_internal_loop_post(struct us_loop_t *loop) {
    us_internal_free_closed_sockets(loop);
    loop->data.post_cb(loop);
}